

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

ON_Viewport * __thiscall ON_Viewport::ShallowCopy(ON_Viewport *this,ON_Viewport *destination)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uchar uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  long lVar12;
  long lVar13;
  ON_Xform *pOVar14;
  ON_Xform *pOVar15;
  byte bVar16;
  
  bVar16 = 0;
  if (destination == (ON_Viewport *)0x0) {
    destination = (ON_Viewport *)operator_new(0x248);
    memset(destination,0,0x248);
    ON_Viewport(destination);
  }
  else {
    ON_Object::PurgeUserData((ON_Object *)destination);
    if (this == destination) {
      return destination;
    }
    operator=(destination,&DefaultTopViewYUp);
  }
  bVar3 = this->m_bValidFrustum;
  bVar4 = this->m_bValidPort;
  bVar5 = this->m_bValidCameraFrame;
  destination->m_bValidCamera = this->m_bValidCamera;
  destination->m_bValidFrustum = bVar3;
  destination->m_bValidPort = bVar4;
  destination->m_bValidCameraFrame = bVar5;
  destination->m_projection = this->m_projection;
  bVar3 = this->m_bLockCamDir;
  bVar4 = this->m_bLockCamLoc;
  uVar6 = this->m_frustum_symmetry_flags;
  destination->m_bLockCamUp = this->m_bLockCamUp;
  destination->m_bLockCamDir = bVar3;
  destination->m_bLockCamLoc = bVar4;
  destination->m_frustum_symmetry_flags = uVar6;
  (destination->m_CamLoc).z = (this->m_CamLoc).z;
  dVar1 = (this->m_CamLoc).y;
  (destination->m_CamLoc).x = (this->m_CamLoc).x;
  (destination->m_CamLoc).y = dVar1;
  (destination->m_CamDir).z = (this->m_CamDir).z;
  dVar1 = (this->m_CamDir).y;
  (destination->m_CamDir).x = (this->m_CamDir).x;
  (destination->m_CamDir).y = dVar1;
  (destination->m_CamUp).z = (this->m_CamUp).z;
  dVar1 = (this->m_CamUp).y;
  (destination->m_CamUp).x = (this->m_CamUp).x;
  (destination->m_CamUp).y = dVar1;
  (destination->m_CamX).z = (this->m_CamX).z;
  dVar1 = (this->m_CamX).y;
  (destination->m_CamX).x = (this->m_CamX).x;
  (destination->m_CamX).y = dVar1;
  (destination->m_CamY).z = (this->m_CamY).z;
  dVar1 = (this->m_CamY).y;
  (destination->m_CamY).x = (this->m_CamY).x;
  (destination->m_CamY).y = dVar1;
  (destination->m_CamZ).z = (this->m_CamZ).z;
  dVar1 = (this->m_CamZ).y;
  (destination->m_CamZ).x = (this->m_CamZ).x;
  (destination->m_CamZ).y = dVar1;
  dVar1 = this->m_frus_right;
  destination->m_frus_left = this->m_frus_left;
  destination->m_frus_right = dVar1;
  dVar1 = this->m_frus_top;
  destination->m_frus_bottom = this->m_frus_bottom;
  destination->m_frus_top = dVar1;
  dVar1 = this->m_frus_far;
  destination->m_frus_near = this->m_frus_near;
  destination->m_frus_far = dVar1;
  iVar7 = this->m_port_right;
  iVar8 = this->m_port_bottom;
  iVar9 = this->m_port_top;
  destination->m_port_left = this->m_port_left;
  destination->m_port_right = iVar7;
  destination->m_port_bottom = iVar8;
  destination->m_port_top = iVar9;
  iVar7 = this->m_port_far;
  destination->m_port_near = this->m_port_near;
  destination->m_port_far = iVar7;
  dVar1 = (this->m_target_point).y;
  (destination->m_target_point).x = (this->m_target_point).x;
  (destination->m_target_point).y = dVar1;
  (destination->m_target_point).z = (this->m_target_point).z;
  uVar10 = (this->m_viewport_id).Data2;
  uVar11 = (this->m_viewport_id).Data3;
  uVar2 = *(undefined8 *)(this->m_viewport_id).Data4;
  (destination->m_viewport_id).Data1 = (this->m_viewport_id).Data1;
  (destination->m_viewport_id).Data2 = uVar10;
  (destination->m_viewport_id).Data3 = uVar11;
  *(undefined8 *)(destination->m_viewport_id).Data4 = uVar2;
  lVar13 = 0x10;
  pOVar14 = &this->m_clip_mods;
  pOVar15 = &destination->m_clip_mods;
  for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
    pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
    pOVar14 = (ON_Xform *)((long)pOVar14 + (ulong)bVar16 * -0x10 + 8);
    pOVar15 = (ON_Xform *)((long)pOVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  pOVar14 = &this->m_clip_mods_inverse;
  pOVar15 = &destination->m_clip_mods_inverse;
  for (; lVar13 != 0; lVar13 = lVar13 + -1) {
    pOVar15->m_xform[0][0] = pOVar14->m_xform[0][0];
    pOVar14 = (ON_Xform *)((long)pOVar14 + (ulong)bVar16 * -0x10 + 8);
    pOVar15 = (ON_Xform *)((long)pOVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  dVar1 = this->m__MIN_NEAR_OVER_FAR;
  destination->m__MIN_NEAR_DIST = this->m__MIN_NEAR_DIST;
  destination->m__MIN_NEAR_OVER_FAR = dVar1;
  return destination;
}

Assistant:

ON_Viewport* ON_Viewport::ShallowCopy(ON_Viewport* destination) const
{
  if (nullptr == destination)
    destination = new ON_Viewport();
  else
  {
    destination->PurgeUserData();
    if (this == destination)
      return destination; // The caller is probably confused but this is what they should get.
    *destination = ON_Viewport::DefaultTopViewYUp; // default ctor values
  }

#define ON_INTERNAL_SHALLOW_FIELD_COPY(field) destination->field = this->field
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidCamera);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidFrustum);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidPort);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidCameraFrame);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_projection);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamUp);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamDir);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamLoc);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frustum_symmetry_flags);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamLoc);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamDir);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamUp);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamX);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamY);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamZ);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_left);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_right);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_bottom);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_top);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_near);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_far);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_left);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_right);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_bottom);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_top);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_near);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_far);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_target_point);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_viewport_id);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_clip_mods);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_clip_mods_inverse);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m__MIN_NEAR_DIST);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m__MIN_NEAR_OVER_FAR);
#undef ON_INTERNAL_SHALLOW_COPY
  return destination;
}